

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts3HashElem * fts3FindElementByHash(Fts3Hash *pH,void *pKey,int nKey,int h)

{
  _fts3ht *p_Var1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  Fts3HashElem *pFVar5;
  bool bVar6;
  
  if (pH->ht == (_fts3ht *)0x0) {
    return (Fts3HashElem *)0x0;
  }
  p_Var1 = pH->ht + h;
  pFVar5 = (Fts3HashElem *)&p_Var1->chain;
  iVar3 = p_Var1->count;
  pcVar4 = fts3BinCompare;
  if (pH->keyClass == '\x01') {
    pcVar4 = fts3StrCompare;
  }
  while( true ) {
    bVar6 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar6) {
      return (Fts3HashElem *)0x0;
    }
    pFVar5 = pFVar5->next;
    if (pFVar5 == (Fts3HashElem *)0x0) break;
    iVar2 = (*pcVar4)(pFVar5->pKey,pFVar5->nKey,pKey,nKey);
    if (iVar2 == 0) {
      return pFVar5;
    }
  }
  return (Fts3HashElem *)0x0;
}

Assistant:

static Fts3HashElem *fts3FindElementByHash(
  const Fts3Hash *pH, /* The pH to be searched */
  const void *pKey,   /* The key we are searching for */
  int nKey,
  int h               /* The hash for this key. */
){
  Fts3HashElem *elem;            /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */
  int (*xCompare)(const void*,int,const void*,int);  /* comparison function */

  if( pH->ht ){
    struct _fts3ht *pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
    xCompare = ftsCompareFunction(pH->keyClass);
    while( count-- && elem ){
      if( (*xCompare)(elem->pKey,elem->nKey,pKey,nKey)==0 ){ 
        return elem;
      }
      elem = elem->next;
    }
  }
  return 0;
}